

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_QueueSetOutputFilterParameters
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,
               FAudioFilterParameters *pParameters,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  undefined8 in_RDX;
  FAudioVoice *in_RSI;
  FAudio_OPERATIONSET_Operation *op;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x135268);
  pFVar1 = QueueOperation(in_RSI,(FAudio_OPERATIONSET_Type)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX)
  ;
  (pFVar1->Data).SetOutputFilterParameters.pDestinationVoice = in_RSI;
  SDL_memcpy((undefined1 *)((long)&pFVar1->Data + 8),in_RDX,0xc);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x1352b8);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetOutputFilterParameters(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	const FAudioFilterParameters *pParameters,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETOUTPUTFILTERPARAMETERS,
		OperationSet
	);

	op->Data.SetOutputFilterParameters.pDestinationVoice = pDestinationVoice;
	FAudio_memcpy(
		&op->Data.SetOutputFilterParameters.Parameters,
		pParameters,
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}